

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classarray.h
# Opt level: O0

ptrdiff_t __thiscall
soplex::
ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
::reMax(ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        *this,int newMax,int newSize)

{
  uint uVar1;
  int iVar2;
  int in_EDX;
  int in_ESI;
  ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *in_RDI;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  **unaff_retaddr;
  ptrdiff_t pshift;
  int i;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *newMem;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffffb8;
  int iVar3;
  uint in_stack_ffffffffffffffc4;
  int local_24;
  int local_18;
  int local_14;
  undefined8 in_stack_fffffffffffffff8;
  long lVar4;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  local_18 = in_EDX;
  if (in_EDX < 0) {
    local_18 = size(in_RDI);
  }
  local_14 = in_ESI;
  if (in_ESI < 1) {
    local_14 = 1;
  }
  if (local_14 < local_18) {
    local_14 = local_18;
  }
  if (local_14 == in_RDI->themax) {
    in_RDI->thesize = local_18;
    lVar4 = 0;
  }
  else {
    spx_alloc<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
              (unaff_retaddr,iVar3);
    local_24 = 0;
    while( true ) {
      iVar3 = local_24;
      iVar2 = size(in_RDI);
      uVar1 = in_stack_ffffffffffffffc4 & 0xffffff;
      if (iVar3 < iVar2) {
        uVar1 = CONCAT13(local_24 < local_18,(int3)in_stack_ffffffffffffffc4);
      }
      in_stack_ffffffffffffffc4 = uVar1;
      if ((char)(in_stack_ffffffffffffffc4 >> 0x18) == '\0') break;
      Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Nonzero((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_ffffffffffffffc4,iVar3),in_stack_ffffffffffffffb8);
      local_24 = local_24 + 1;
    }
    for (; local_24 < local_14; local_24 = local_24 + 1) {
      Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Nonzero(in_stack_ffffffffffffffb8);
    }
    lVar4 = -(long)in_RDI->data;
    local_24 = in_RDI->themax;
    do {
      local_24 = local_24 + -1;
    } while (-1 < local_24);
    spx_free<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
              ((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                **)0x4ee1cc);
    in_RDI->data = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x0;
    in_RDI->themax = local_14;
    in_RDI->thesize = local_18;
  }
  return lVar4;
}

Assistant:

ptrdiff_t reMax(int newMax = 1, int newSize = -1)
   {
      /* process input */
      if(newSize < 0)
         newSize = size();

      if(newMax < 1)
         newMax = 1;

      if(newMax < newSize)
         newMax = newSize;

      /* nothing to reallocate */
      if(newMax == themax)
      {
         thesize = newSize;
         return 0;
      }

      /* allocate new memory */
      T* newMem = nullptr;
      spx_alloc(newMem, newMax);

      /* call copy constructor for first elements */
      int i;

      for(i = 0; i < size() && i < newSize; i++)
         new(&(newMem[i])) T(data[i]);

      /* call default constructor for remaining elements */
      for(; i < newMax; i++)
         new(&(newMem[i])) T();

      /* compute pointer difference */
      ptrdiff_t pshift = reinterpret_cast<char*>(newMem) - reinterpret_cast<char*>(data);

      /* free old memory */
      for(i = themax - 1; i >= 0; i--)
         data[i].~T();

      spx_free(data);

      /* assign new memory */
      data = newMem;
      themax = newMax;
      thesize = newSize;

      return pshift;
   }